

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::removeSatisfiedClause(Solver *this,CRef cr,bool remove_from_proof)

{
  bool bVar1;
  int iVar2;
  Lit *pLVar3;
  byte in_DL;
  Solver *in_RDI;
  Solver *unaff_retaddr;
  vec<Minisat::Lit> unitClause;
  Lit unit;
  int i;
  Clause *c;
  undefined8 in_stack_ffffffffffffff98;
  vec<Minisat::Lit> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint i_00;
  Lit in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uchar in_stack_ffffffffffffffbf;
  Solver *in_stack_ffffffffffffffc0;
  Clause *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  lbool local_25;
  int local_24;
  lbool local_1d;
  uint local_1c;
  Clause *local_18;
  byte local_d;
  Solver *pSVar4;
  
  local_d = in_DL & 1;
  pSVar4 = in_RDI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (Ref)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if ((in_RDI->drup_file != (FILE *)0x0) &&
     (bVar1 = locked((Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8), bVar1)) {
    iVar2 = Clause::size(local_18);
    if (iVar2 == 2) {
      pLVar3 = Clause::operator[](local_18,0);
      local_24 = pLVar3->x;
      local_1d = value(in_RDI,in_stack_ffffffffffffffb0);
      lbool::lbool(&local_25,'\0');
      bVar1 = lbool::operator==(&local_1d,local_25);
      i_00 = (uint)!bVar1;
    }
    else {
      i_00 = 0;
    }
    local_1c = i_00;
    Clause::operator[](local_18,i_00);
    this_00 = (vec<Minisat::Lit> *)&stack0xffffffffffffffc0;
    vec<Minisat::Lit>::vec(this_00);
    vec<Minisat::Lit>::push
              ((vec<Minisat::Lit> *)CONCAT44(i_00,in_stack_ffffffffffffffa0),(Lit *)this_00);
    binDRUP<Minisat::vec<Minisat::Lit>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,
               (vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0.x),
               (FILE *)in_RDI);
    vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x12f906);
  }
  removeClause(unaff_retaddr,(CRef)((ulong)pSVar4 >> 0x20),SUB81((ulong)pSVar4 >> 0x18,0));
  return;
}

Assistant:

void Solver::removeSatisfiedClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];

    if (drup_file && locked(c)) {
        // The following line was copied from Solver::locked.
        int i = c.size() != 2 ? 0 : (value(c[0]) == l_True ? 0 : 1);
        Lit unit = c[i];
#ifdef BIN_DRUP
        vec<Lit> unitClause;
        unitClause.push(unit);
        binDRUP('a', unitClause, drup_file);
#else
        fprintf(drup_file, "%i 0\n", (var(unit) + 1) * (-2 * sign(unit) + 1));
#endif
    }

    removeClause(cr, remove_from_proof);
}